

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

void p_hash_table_remove(PHashTable *table,pconstpointer key)

{
  PHashTableNode *pPVar1;
  PHashTableNode *pPVar2;
  PHashTableNode *pPVar3;
  PHashTableNode *pPVar4;
  
  if (table != (PHashTable *)0x0) {
    pPVar2 = (PHashTableNode *)
             (table->table + ((ulong)(long)((int)key + 0x25) % table->size & 0xffffffff));
    pPVar3 = pPVar2;
    do {
      pPVar3 = pPVar3->next;
      if (pPVar3 == (PHashTableNode *)0x0) {
        return;
      }
    } while (pPVar3->key != key);
    pPVar3 = pPVar2;
    pPVar1 = (PHashTableNode *)0x0;
    while (pPVar4 = pPVar1, pPVar3 = pPVar3->next, pPVar3 != (PHashTableNode *)0x0) {
      pPVar1 = pPVar3;
      if (pPVar3->key == key) {
        if (pPVar4 != (PHashTableNode *)0x0) {
          pPVar2 = pPVar4;
        }
        pPVar2->next = pPVar3->next;
        p_free(pPVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_remove (PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	PHashTableNode	*prev_node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if (pp_hash_table_find_node (table, key, hash) != NULL) {
		node = table->table[hash];
		prev_node = NULL;

		while (node != NULL) {
			if (node->key == key) {
				if (prev_node == NULL)
					table->table[hash] = node->next;
				else
					prev_node->next = node->next;

				p_free (node);
				break;
			} else {
				prev_node = node;
				node = node->next;
			}
		}
	}
}